

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCheck.c
# Opt level: O1

int Aig_ManCheck(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  Aig_Obj_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  ulong uVar8;
  long lVar9;
  Aig_Obj_t *pGhost;
  char *__format;
  
  lVar4 = (long)p->vCis->nSize;
  if (0 < lVar4) {
    lVar9 = 0;
    do {
      pGhost = (Aig_Obj_t *)p->vCis->pArray[lVar9];
      if (((Aig_Obj_t *)0x1 < pGhost->pFanin0) || ((Aig_Obj_t *)0x1 < pGhost->pFanin1)) {
        __format = "Aig_ManCheck: The PI node \"%p\" has fanins.\n";
        goto LAB_006ac3fa;
      }
      lVar9 = lVar9 + 1;
    } while (lVar4 != lVar9);
  }
  lVar4 = (long)p->vCos->nSize;
  if (0 < lVar4) {
    lVar9 = 0;
    do {
      pGhost = (Aig_Obj_t *)p->vCos->pArray[lVar9];
      if (pGhost->pFanin0 < (Aig_Obj_t *)0x2) {
        __format = "Aig_ManCheck: The PO node \"%p\" has NULL fanin.\n";
        goto LAB_006ac3fa;
      }
      if ((Aig_Obj_t *)0x1 < pGhost->pFanin1) {
        __format = "Aig_ManCheck: The PO node \"%p\" has second fanin.\n";
        goto LAB_006ac3fa;
      }
      lVar9 = lVar9 + 1;
    } while (lVar4 != lVar9);
  }
  pVVar7 = p->vObjs;
  iVar1 = pVVar7->nSize;
  if (0 < iVar1) {
    lVar4 = 0;
    do {
      pGhost = (Aig_Obj_t *)pVVar7->pArray[lVar4];
      if ((pGhost != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pGhost->field_0x18 & 7) - 7)) {
        uVar5 = (ulong)pGhost->pFanin0 & 0xfffffffffffffffe;
        if ((uVar5 == 0) || (uVar8 = (ulong)pGhost->pFanin1 & 0xfffffffffffffffe, uVar8 == 0)) {
          __format = "Aig_ManCheck: The AIG has internal node \"%p\" with a NULL fanin.\n";
LAB_006ac3fa:
          printf(__format,pGhost);
          return 0;
        }
        if (*(int *)(uVar8 + 0x24) <= *(int *)(uVar5 + 0x24)) {
          __format = "Aig_ManCheck: The AIG has node \"%p\" with a wrong ordering of fanins.\n";
          goto LAB_006ac3fa;
        }
        pAVar6 = Aig_TableLookup(p,pGhost);
        if (pAVar6 != pGhost) {
          __format = "Aig_ManCheck: Node \"%p\" is not in the structural hashing table.\n";
          goto LAB_006ac3fa;
        }
      }
      lVar4 = lVar4 + 1;
      pVVar7 = p->vObjs;
      iVar1 = pVVar7->nSize;
    } while (lVar4 < iVar1);
  }
  if (iVar1 - p->nDeleted == p->nObjs[2] + p->nObjs[3] + p->nObjs[4] + p->nObjs[5] + p->nObjs[6] + 1
     ) {
    iVar2 = Aig_TableCountEntries(p);
    iVar1 = 1;
    if (iVar2 != p->nObjs[6] + p->nObjs[5]) {
      puts("Aig_ManCheck: The number of nodes in the structural hashing table is wrong.");
      uVar3 = Aig_TableCountEntries(p);
      iVar1 = 0;
      printf("Entries = %d. And = %d. Xor = %d. Total = %d.\n",(ulong)uVar3,(ulong)(uint)p->nObjs[5]
             ,(ulong)(uint)p->nObjs[6],(ulong)(uint)(p->nObjs[6] + p->nObjs[5]));
    }
  }
  else {
    puts("Aig_ManCheck: The number of created nodes is wrong.");
    iVar1 = 0;
    printf("C1 = %d. Pi = %d. Po = %d. Buf = %d. And = %d. Xor = %d. Total = %d.\n",1);
    uVar3 = p->vObjs->nSize;
    printf("Created = %d. Deleted = %d. Existing = %d.\n",(ulong)uVar3,(ulong)(uint)p->nDeleted,
           (ulong)(uVar3 - p->nDeleted));
  }
  return iVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Checks the consistency of the AIG manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Aig_ManCheck( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pObj2;
    int i;
    // check primary inputs
    Aig_ManForEachCi( p, pObj, i )
    {
        if ( Aig_ObjFanin0(pObj) || Aig_ObjFanin1(pObj) )
        {
            printf( "Aig_ManCheck: The PI node \"%p\" has fanins.\n", pObj );
            return 0;
        }
    }
    // check primary outputs
    Aig_ManForEachCo( p, pObj, i )
    {
        if ( !Aig_ObjFanin0(pObj) )
        {
            printf( "Aig_ManCheck: The PO node \"%p\" has NULL fanin.\n", pObj );
            return 0;
        }
        if ( Aig_ObjFanin1(pObj) )
        {
            printf( "Aig_ManCheck: The PO node \"%p\" has second fanin.\n", pObj );
            return 0;
        }
    }
    // check internal nodes
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        if ( !Aig_ObjFanin0(pObj) || !Aig_ObjFanin1(pObj) )
        {
            printf( "Aig_ManCheck: The AIG has internal node \"%p\" with a NULL fanin.\n", pObj );
            return 0;
        }
        if ( Aig_ObjFanin0(pObj)->Id >= Aig_ObjFanin1(pObj)->Id )
        {
            printf( "Aig_ManCheck: The AIG has node \"%p\" with a wrong ordering of fanins.\n", pObj );
            return 0;
        }
        pObj2 = Aig_TableLookup( p, pObj );
        if ( pObj2 != pObj )
        {
            printf( "Aig_ManCheck: Node \"%p\" is not in the structural hashing table.\n", pObj );
            return 0;
        }
    }
    // count the total number of nodes
    if ( Aig_ManObjNum(p) != 1 + Aig_ManCiNum(p) + Aig_ManCoNum(p) + 
        Aig_ManBufNum(p) + Aig_ManAndNum(p) + Aig_ManExorNum(p) )
    {
        printf( "Aig_ManCheck: The number of created nodes is wrong.\n" );
        printf( "C1 = %d. Pi = %d. Po = %d. Buf = %d. And = %d. Xor = %d. Total = %d.\n",
            1, Aig_ManCiNum(p), Aig_ManCoNum(p), Aig_ManBufNum(p), Aig_ManAndNum(p), Aig_ManExorNum(p), 
            1 + Aig_ManCiNum(p) + Aig_ManCoNum(p) + Aig_ManBufNum(p) + Aig_ManAndNum(p) + Aig_ManExorNum(p) );
        printf( "Created = %d. Deleted = %d. Existing = %d.\n",
            Aig_ManObjNumMax(p), p->nDeleted, Aig_ManObjNum(p) );
        return 0;
    }
    // count the number of nodes in the table
    if ( Aig_TableCountEntries(p) != Aig_ManAndNum(p) + Aig_ManExorNum(p) )
    {
        printf( "Aig_ManCheck: The number of nodes in the structural hashing table is wrong.\n" );
        printf( "Entries = %d. And = %d. Xor = %d. Total = %d.\n", 
            Aig_TableCountEntries(p), Aig_ManAndNum(p), Aig_ManExorNum(p), 
            Aig_ManAndNum(p) + Aig_ManExorNum(p) );

        return 0;
    }
//    if ( !Aig_ManIsAcyclic(p) )
//        return 0;
    return 1; 
}